

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void fejer1_compute(int n,double *x,double *w)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  double dVar4;
  double dVar5;
  double *theta;
  double r8_pi;
  int j;
  int i;
  double *w_local;
  double *x_local;
  int n_local;
  
  if (0 < n) {
    if (n == 1) {
      *x = 0.0;
      *w = 2.0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)n;
      uVar2 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      pvVar3 = operator_new__(uVar2);
      for (r8_pi._4_4_ = 1; r8_pi._4_4_ <= n; r8_pi._4_4_ = r8_pi._4_4_ + 1) {
        *(double *)((long)pvVar3 + (long)(r8_pi._4_4_ + -1) * 8) =
             ((double)((n - r8_pi._4_4_) * 2 + 1) * 3.141592653589793) / (double)(n << 1);
      }
      for (r8_pi._4_4_ = 0; r8_pi._4_4_ < n; r8_pi._4_4_ = r8_pi._4_4_ + 1) {
        dVar4 = cos(*(double *)((long)pvVar3 + (long)r8_pi._4_4_ * 8));
        x[r8_pi._4_4_] = dVar4;
      }
      for (r8_pi._4_4_ = 0; r8_pi._4_4_ < n; r8_pi._4_4_ = r8_pi._4_4_ + 1) {
        w[r8_pi._4_4_] = 1.0;
        for (r8_pi._0_4_ = 1; r8_pi._0_4_ <= n / 2; r8_pi._0_4_ = r8_pi._0_4_ + 1) {
          dVar4 = w[r8_pi._4_4_];
          dVar5 = cos((double)r8_pi._0_4_ * 2.0 * *(double *)((long)pvVar3 + (long)r8_pi._4_4_ * 8))
          ;
          w[r8_pi._4_4_] = dVar4 - (dVar5 * 2.0) / (double)(r8_pi._0_4_ * 4 * r8_pi._0_4_ + -1);
        }
      }
      for (r8_pi._4_4_ = 0; r8_pi._4_4_ < n; r8_pi._4_4_ = r8_pi._4_4_ + 1) {
        w[r8_pi._4_4_] = (w[r8_pi._4_4_] * 2.0) / (double)n;
      }
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
      }
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"FEJER1_COMPUTE - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  N < 1.\n");
  exit(1);
}

Assistant:

void fejer1_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEJER1_COMPUTE computes a Fejer type 1 quadrature rule.
//
//  Discussion:
//
//    This method uses a direct approach.  The paper by Waldvogel
//    exhibits a more efficient approach using Fourier transforms.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 March 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//    Walter Gautschi,
//    Numerical Quadrature in the Presence of a Singularity,
//    SIAM Journal on Numerical Analysis,
//    Volume 4, Number 3, 1967, pages 357-362.
//
//    Joerg Waldvogel,
//    Fast Construction of the Fejer and Clenshaw-Curtis Quadrature Rules,
//    BIT Numerical Mathematics,
//    Volume 43, Number 1, 2003, pages 1-18.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;
  int j;
  const double r8_pi = 3.141592653589793;
  double *theta;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "FEJER1_COMPUTE - Fatal error!\n";
    std::cerr << "  N < 1.\n";
    exit ( 1 );
  }

  if ( n == 1 )
  {
    x[0] = 0.0;
    w[0] = 2.0;
    return;
  }

  theta = new double[n];

  for ( i = 1; i <= n; i++ )
  {
    theta[i-1] = double( 2 * ( n - i ) + 1 ) * r8_pi
               / double( 2 * n     );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = cos ( theta[i] );
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 1.0;
    for ( j = 1; j <= ( n / 2 ); j++ )
    {
      w[i] = w[i] - 2.0
        * cos ( 2.0 * double( j ) * theta[i] ) 
        / double( 4 * j * j - 1 );
    }
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 2.0 * w[i] / double( n );
  }

  delete [] theta;

  return;
}